

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectPrototypeObject.cpp
# Opt level: O0

Var Js::ObjectPrototypeObject::Entry__proto__setter
              (RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  CallFlags e;
  BOOL BVar3;
  ScriptContext *pSVar4;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar5;
  Var pvVar6;
  Var instance;
  JavascriptLibrary *pJVar7;
  RecyclableObject *pRVar8;
  RecyclableObject *newPrototype_00;
  RecyclableObject *newPrototype;
  RecyclableObject *object;
  Var arg0;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar4 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar4);
  pSVar4 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar4,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ObjectPrototypeObject.cpp"
                                ,0x36,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar2 = operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ObjectPrototypeObject.cpp"
                                ,0x37,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pSVar4 = RecyclableObject::GetScriptContext(function);
  pvVar6 = Arguments::operator[]((Arguments *)&scriptContext,0);
  if ((((ulong)scriptContext & 0xffffff) != 0) &&
     (BVar3 = JavascriptConversion::CheckObjectCoercible(pvVar6,pSVar4), BVar3 != 0)) {
    if (1 < ((uint)scriptContext & 0xffffff)) {
      instance = Arguments::operator[]((Arguments *)&scriptContext,1);
      BVar3 = Js::JavascriptOperators::IsObjectOrNull(instance);
      if ((BVar3 != 0) && (BVar3 = Js::JavascriptOperators::IsObject(pvVar6), BVar3 != 0)) {
        pRVar8 = VarTo<Js::RecyclableObject>(pvVar6);
        pvVar6 = Arguments::operator[]((Arguments *)&scriptContext,1);
        newPrototype_00 = VarTo<Js::RecyclableObject>(pvVar6);
        JavascriptObject::ChangePrototype(pRVar8,newPrototype_00,true,pSVar4);
        pJVar7 = ScriptContext::GetLibrary(pSVar4);
        pRVar8 = JavascriptLibraryBase::GetUndefined(&pJVar7->super_JavascriptLibraryBase);
        return pRVar8;
      }
    }
    pJVar7 = ScriptContext::GetLibrary(pSVar4);
    pRVar8 = JavascriptLibraryBase::GetUndefined(&pJVar7->super_JavascriptLibraryBase);
    return pRVar8;
  }
  JavascriptError::ThrowTypeError(pSVar4,-0x7ff5ec41,L"Object.prototype.__proto__");
}

Assistant:

Var ObjectPrototypeObject::Entry__proto__setter(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        Assert(!(callInfo.Flags & CallFlags_New));
        ScriptContext* scriptContext = function->GetScriptContext();

        // B.2.2.1.2
        // set Object.prototype.__proto__ ( proto )
        // The value of the [[Set]] attribute is a built-in function that takes an argument proto. It performs the following steps:

#if !FLOATVAR
        // Mark temp number will stack allocate number that is used as the object ptr.
        // So we should box it before call ToObject on it.
        Var arg0 = JavascriptNumber::BoxStackNumber(args[0], scriptContext);
#else
        Var arg0 = args[0];
#endif

        // 1. Let O be RequireObjectCoercible(this value).
        // 2. ReturnIfAbrupt(O).
        // 3. If Type(proto) is neither Object nor Null, return undefined.
        // 4. If Type(O) is not Object, return undefined.
        if (args.Info.Count < 1 || !JavascriptConversion::CheckObjectCoercible(arg0, scriptContext))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedObject, _u("Object.prototype.__proto__"));
        }
        else if (args.Info.Count < 2 || !JavascriptOperators::IsObjectOrNull(args[1]) || !JavascriptOperators::IsObject(arg0))
        {
            return scriptContext->GetLibrary()->GetUndefined();
        }

        RecyclableObject* object = VarTo<RecyclableObject>(arg0);
        RecyclableObject* newPrototype = VarTo<RecyclableObject>(args[1]);

        // 5. Let status be O.[[SetPrototypeOf]](proto).
        // 6. ReturnIfAbrupt(status).
        // 7. If status is false, throw a TypeError exception.
        JavascriptObject::ChangePrototype(object, newPrototype, /*shouldThrow*/true, scriptContext);

        // 8.   Return undefined.
        return scriptContext->GetLibrary()->GetUndefined();
    }